

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

uint128 absl::anon_unknown_2::MakeUint128FromFloat(longdouble v)

{
  bool bVar1;
  longdouble lVar2;
  bool bVar3;
  int amount;
  ulong uVar4;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double __x;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint128 uVar8;
  uint128 lhs;
  uint128 local_a8;
  uint128 local_98;
  uint128 local_88;
  uint128 local_78;
  uint128 local_68;
  uint128 local_58;
  ulong local_40;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  longdouble v_local;
  
  _w0 = v;
  bVar3 = std::isfinite(v);
  lVar2 = _w0;
  bVar1 = false;
  dVar5 = __x;
  if ((bVar3) && (bVar1 = false, -(longdouble)1 < _w0)) {
    in_ST1 = in_ST2;
    in_ST3 = in_ST4;
    dVar5 = std::ldexp(__x,0x80);
    bVar1 = lVar2 < in_ST0;
  }
  if (bVar1) {
    dVar5 = std::ldexp(dVar5,-100);
    std::trunc(dVar5);
    w1 = (long)in_ST1 | (long)((double)in_ST1 - 9.223372036854776e+18) & (long)in_ST1 >> 0x3f;
    auVar6._8_4_ = (int)(w1 >> 0x20);
    auVar6._0_8_ = w1;
    auVar6._12_4_ = 0x45300000;
    dVar5 = std::ldexp((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)w1) - 4503599627370496.0),0x32);
    std::trunc(dVar5);
    w2 = (long)in_ST3 | (long)((double)in_ST3 - 9.223372036854776e+18) & (long)in_ST3 >> 0x3f;
    auVar7._8_4_ = (int)(w2 >> 0x20);
    auVar7._0_8_ = w2;
    auVar7._12_4_ = 0x45300000;
    dVar5 = std::ldexp((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)w2) - 4503599627370496.0),0x32);
    std::trunc(dVar5);
    uVar4 = (long)((double)in_ST5 - 9.223372036854776e+18) & (long)in_ST5 >> 0x3f;
    local_40 = (long)in_ST5 | uVar4;
    uint128::uint128(&local_78,w1);
    uVar8.hi_ = 100;
    uVar8.lo_ = local_78.hi_;
    amount = (int)uVar4;
    local_68 = operator<<((absl *)local_78.lo_,uVar8,amount);
    uint128::uint128(&local_98,w2);
    lhs.hi_._0_4_ = 0x32;
    lhs.lo_ = local_98.hi_;
    lhs.hi_._4_4_ = 0;
    local_88 = operator<<((absl *)local_98.lo_,lhs,amount);
    local_58 = operator|(local_68,local_88);
    uint128::uint128(&local_a8,local_40);
    uVar8 = operator|(local_58,local_a8);
    return uVar8;
  }
  __assert_fail("std::isfinite(v) && v > -1 && v < std::ldexp(1.0L, 128)",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                ,0x7b,"uint128 absl::(anonymous namespace)::MakeUint128FromFloat(long double)");
}

Assistant:

uint128 MakeUint128FromFloat(long double v) {
  // Go 50 bits at a time, that fits in a double
  static_assert(std::numeric_limits<double>::digits >= 50, "");
  static_assert(std::numeric_limits<long double>::digits <= 150, "");
  // Undefined behavior if v is not finite or cannot fit into uint128.
  assert(std::isfinite(v) && v > -1 && v < std::ldexp(1.0L, 128));

  v = std::ldexp(v, -100);
  uint64_t w0 = static_cast<uint64_t>(static_cast<double>(std::trunc(v)));
  v = std::ldexp(v - static_cast<double>(w0), 50);
  uint64_t w1 = static_cast<uint64_t>(static_cast<double>(std::trunc(v)));
  v = std::ldexp(v - static_cast<double>(w1), 50);
  uint64_t w2 = static_cast<uint64_t>(static_cast<double>(std::trunc(v)));
  return (static_cast<uint128>(w0) << 100) | (static_cast<uint128>(w1) << 50) |
         static_cast<uint128>(w2);
}